

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::FunctionCall::FunctionCall
          (FunctionCall *this,Context *c,Function *function,
          pool_ptr<soul::AST::CommaSeparatedList> *args,bool isMethod)

{
  pool_ptr<soul::AST::CommaSeparatedList> local_38;
  undefined1 local_29;
  pool_ptr<soul::AST::CommaSeparatedList> *ppStack_28;
  bool isMethod_local;
  pool_ptr<soul::AST::CommaSeparatedList> *args_local;
  Function *function_local;
  Context *c_local;
  FunctionCall *this_local;
  
  local_38 = (pool_ptr<soul::AST::CommaSeparatedList>)args->object;
  local_29 = isMethod;
  ppStack_28 = args;
  args_local = (pool_ptr<soul::AST::CommaSeparatedList> *)function;
  function_local = (Function *)c;
  c_local = (Context *)this;
  CallOrCastBase::CallOrCastBase(&this->super_CallOrCastBase,FunctionCall,c,&local_38,isMethod);
  pool_ptr<soul::AST::CommaSeparatedList>::~pool_ptr(&local_38);
  (this->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__FunctionCall_005895d0;
  this->targetFunction = (Function *)args_local;
  return;
}

Assistant:

FunctionCall (const Context& c, Function& function, pool_ptr<CommaSeparatedList> args, bool isMethod)
            : CallOrCastBase (ObjectType::FunctionCall, c, args, isMethod), targetFunction (function)
        {}